

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsGroupOf_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::IsGroupOf_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IsGroupOf_PDU *this)

{
  long lVar1;
  KString *pKVar2;
  ostream *poVar3;
  pointer pKVar4;
  KINT32 Value;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  KStringStream ss;
  KString local_220;
  KString *local_200;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_220,&this->super_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Is Group Of PDU-\n",0x12);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1d8,&this->m_GroupedEntityID);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Grouped Entity Category:         ",0x21);
  DATA_TYPE::ENUMS::GetEnumAsStringGroupedEntityCategory_abi_cxx11_
            (&local_1f8,(ENUMS *)(ulong)this->m_ui8GrpdEntCat,Value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Number Of Grouped Entity:        ",0x21);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Group Reference Point(Lat,Lon) : ",0x21);
  poVar3 = std::ostream::_M_insert<double>((double)this->m_f64GrpLat);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," , ",3);
  poVar3 = std::ostream::_M_insert<double>((double)this->m_f64GrpLon);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_200 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  pKVar4 = (this->m_vpGED).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vpGED).
      super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pKVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      (*((pKVar4[uVar5].m_pRef)->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      pKVar4 = (this->m_vpGED).
               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->m_vpGED).
                     super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::GED>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4 >> 3) *
              -0x5555555555555555;
      bVar7 = uVar6 <= uVar5;
      lVar1 = uVar5 - uVar6;
      uVar5 = uVar6;
      uVar6 = (ulong)(byte)((char)uVar6 + 1);
    } while (bVar7 && lVar1 != 0);
  }
  pKVar2 = local_200;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString IsGroupOf_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Is Group Of PDU-\n"
       << m_GroupedEntityID.GetAsString()
       << "Grouped Entity Category:         " << GetEnumAsStringGroupedEntityCategory( m_ui8GrpdEntCat ) << "\n"
       << "Number Of Grouped Entity:        " << ( KUINT16 )m_ui8NumOfGroupedEnts                        << "\n"
       << "Group Reference Point(Lat,Lon) : " << m_f64GrpLat << " , " << m_f64GrpLon                     << "\n";

    KUINT8 i = 0;

    while( i < m_vpGED.size() )
    {
        ss << m_vpGED[i]->GetAsString();
        ++i;
    }

    return ss.str();
}